

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Builder::Builder(Builder *this,Builder *that)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer puVar3;
  Buffer<unsigned_char> *pBVar4;
  
  (this->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (that->_buffer).
           super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (that->_buffer).
           super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (that->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (that->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  this->_bufferPtr = (Buffer<unsigned_char> *)0x0;
  this->_start = (uint8_t *)0x0;
  this->_pos = that->_pos;
  (this->_arena).ptr_ = (this->_arena).buf_;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Tp_alloc_type.a_ = &this->_arena;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (that->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (that->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
  (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (that->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (that->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (that->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (that->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_keyWritten = that->_keyWritten;
  this->options = that->options;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::reserve(&this->_stack,4);
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::_M_move_assign(&this->_stack,&that->_stack);
  pBVar4 = (this->_buffer).
           super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (pBVar4 == (Buffer<unsigned_char> *)0x0) {
    pBVar4 = that->_bufferPtr;
    this->_bufferPtr = pBVar4;
    if (pBVar4 == (Buffer<unsigned_char> *)0x0) goto LAB_00102ff8;
  }
  else {
    this->_bufferPtr = pBVar4;
  }
  this->_start = pBVar4->_buffer;
LAB_00102ff8:
  that->_bufferPtr = (Buffer<unsigned_char> *)0x0;
  clear(that);
  return;
}

Assistant:

Builder::Builder(Builder&& that) noexcept
    : _buffer(std::move(that._buffer)),
      _bufferPtr(nullptr),
      _start(nullptr),
      _pos(that._pos),
      _arena(),
      _stack(_arena),
      _indexes(std::move(that._indexes)),
      _keyWritten(that._keyWritten),
      options(that.options) {
  // do a full initial allocation in the arena, so we can maximize its usage
  _stack.reserve(arenaSize / sizeof(decltype(_stack)::value_type));
  _stack = std::move(that._stack);

  if (_buffer != nullptr) {
    _bufferPtr = _buffer.get();
  } else {
    _bufferPtr = that._bufferPtr;
  }
  if (_bufferPtr != nullptr) {
    _start = _bufferPtr->data();
  }
  VELOCYPACK_ASSERT(that._buffer == nullptr);
  that._bufferPtr = nullptr;
  that.clear();
}